

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O1

Ref<glTF::Node> FindSkeletonRootJoint(Ref<glTF::Skin> *skinRef)

{
  undefined1 (*pauVar1) [12];
  undefined8 *puVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  Ref<glTF::Node> RVar6;
  
  puVar2 = *(undefined8 **)
            &((skinRef->vector->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
              _M_impl.super__Vector_impl_data._M_start[skinRef->index]->jointNames).
             super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>.
             _M_impl;
  plVar4 = (long *)*puVar2;
  uVar5 = (ulong)*(uint *)(puVar2 + 1);
  do {
    lVar3 = *(long *)(*plVar4 + uVar5 * 8);
    pauVar1 = (undefined1 (*) [12])(lVar3 + 0x158);
    plVar4 = *(long **)*pauVar1;
    uVar5 = (ulong)*(uint *)(lVar3 + 0x160);
  } while (*(long *)(*(long *)(*plVar4 + uVar5 * 8) + 0x140) != 0);
  RVar6._12_4_ = 0;
  RVar6._0_12_ = *pauVar1;
  return RVar6;
}

Assistant:

T* operator->()
            { return (*vector)[index]; }